

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

void vkt::tessellation::submitCommandsAndWait
               (DeviceInterface *vk,VkDevice device,VkQueue queue,VkCommandBuffer commandBuffer)

{
  RefData<vk::Handle<(vk::HandleType)6>_> data;
  VkResult VVar1;
  Handle<(vk::HandleType)6> *pHVar2;
  undefined8 uStack_e8;
  VkSubmitInfo submitInfo;
  Move<vk::Handle<(vk::HandleType)6>_> local_88;
  RefData<vk::Handle<(vk::HandleType)6>_> local_68;
  undefined1 local_48 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  VkCommandBuffer commandBuffer_local;
  VkQueue queue_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)commandBuffer;
  ::vk::createFence(&local_88,vk,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_68,(Move *)&local_88);
  data.deleter.m_deviceIface = local_68.deleter.m_deviceIface;
  data.object.m_internal = local_68.object.m_internal;
  data.deleter.m_device = local_68.deleter.m_device;
  data.deleter.m_allocator = local_68.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_48,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_88);
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_e8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_48);
  VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,queue,1,&uStack_e8,pHVar2->m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/tessellation/vktTessellationUtil.cpp"
                    ,0x11b);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_48);
  VVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,pHVar2,1,0xffffffffffffffff);
  ::vk::checkResult(VVar1,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/tessellation/vktTessellationUtil.cpp"
                    ,0x11c);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_48);
  return;
}

Assistant:

void submitCommandsAndWait (const DeviceInterface&	vk,
							const VkDevice			device,
							const VkQueue			queue,
							const VkCommandBuffer	commandBuffer)
{
	const Unique<VkFence> fence(createFence(vk, device));

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType                sType;
		DE_NULL,							// const void*                    pNext;
		0u,									// uint32_t                       waitSemaphoreCount;
		DE_NULL,							// const VkSemaphore*             pWaitSemaphores;
		DE_NULL,							// const VkPipelineStageFlags*    pWaitDstStageMask;
		1u,									// uint32_t                       commandBufferCount;
		&commandBuffer,						// const VkCommandBuffer*         pCommandBuffers;
		0u,									// uint32_t                       signalSemaphoreCount;
		DE_NULL,							// const VkSemaphore*             pSignalSemaphores;
	};
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));
}